

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

int64_t __thiscall
asio::detail::
chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
::posix_time_duration::duration_cast<1l,1000000l>(posix_time_duration *this)

{
  int64_t iVar1;
  int64_t den;
  int64_t num;
  int64_t den2;
  int64_t den1;
  int64_t num2;
  int64_t num1;
  
  iVar1 = chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::posix_time_duration::ticks((posix_time_duration *)0x345fa8);
  return iVar1 / 1000;
}

Assistant:

int64_t duration_cast() const
    {
      const int64_t num1 = period_type::num / gcd<period_type::num, Num>::value;
      const int64_t num2 = Num / gcd<period_type::num, Num>::value;

      const int64_t den1 = period_type::den / gcd<period_type::den, Den>::value;
      const int64_t den2 = Den / gcd<period_type::den, Den>::value;

      const int64_t num = num1 * den2;
      const int64_t den = num2 * den1;

      if (num == 1 && den == 1)
        return ticks();
      else if (num != 1 && den == 1)
        return ticks() * num;
      else if (num == 1 && period_type::den != 1)
        return ticks() / den;
      else
        return ticks() * num / den;
    }